

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O2

void duckdb::SumFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *this;
  AggregateFunctionSet *in_RDI;
  FunctionNullHandling null_handling;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_8c1;
  undefined1 local_8c0 [48];
  LogicalType local_890 [24];
  LogicalType local_878 [24];
  AggregateFunction local_860;
  AggregateFunction local_730;
  AggregateFunction local_600;
  AggregateFunction local_4d0;
  AggregateFunction local_3a0;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_878,DECIMAL);
  __l._M_len = 1;
  __l._M_array = local_878;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_8c0,__l,
             &local_8c1);
  duckdb::LogicalType::LogicalType(local_890,DECIMAL);
  null_handling = DEFAULT_NULL_HANDLING;
  AggregateFunction::AggregateFunction
            (&local_140,(vector<duckdb::LogicalType,_true> *)local_8c0,local_890,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,DEFAULT_NULL_HANDLING,
             (aggregate_simple_update_t)0x0,BindDecimalSum,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  this = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
         (in_RDI + 0x20);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  duckdb::LogicalType::~LogicalType(local_890);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_8c0);
  duckdb::LogicalType::~LogicalType(local_878);
  GetSumAggregate(&local_270,BOOL);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  GetSumAggregate(&local_3a0,INT16);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_3a0);
  AggregateFunction::~AggregateFunction(&local_3a0);
  GetSumAggregate(&local_4d0,INT32);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_4d0);
  AggregateFunction::~AggregateFunction(&local_4d0);
  GetSumAggregate(&local_600,INT64);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_600);
  AggregateFunction::~AggregateFunction(&local_600);
  GetSumAggregate(&local_730,INT128);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_730);
  AggregateFunction::~AggregateFunction(&local_730);
  duckdb::LogicalType::LogicalType((LogicalType *)local_8c0,DOUBLE);
  duckdb::LogicalType::LogicalType((LogicalType *)(local_8c0 + 0x18),DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::SumState<double>,double,double,duckdb::DoubleSumOperation<duckdb::RegularAdd>,(duckdb::AggregateDestructorType)0>
            (&local_860,(AggregateFunction *)local_8c0,(LogicalType *)(local_8c0 + 0x18),
             (LogicalType *)0x0,null_handling);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,&local_860);
  AggregateFunction::~AggregateFunction(&local_860);
  duckdb::LogicalType::~LogicalType((LogicalType *)(local_8c0 + 0x18));
  duckdb::LogicalType::~LogicalType((LogicalType *)local_8c0);
  return;
}

Assistant:

AggregateFunctionSet SumFun::GetFunctions() {
	AggregateFunctionSet sum;
	// decimal
	sum.AddFunction(AggregateFunction({LogicalTypeId::DECIMAL}, LogicalTypeId::DECIMAL, nullptr, nullptr, nullptr,
	                                  nullptr, nullptr, FunctionNullHandling::DEFAULT_NULL_HANDLING, nullptr,
	                                  BindDecimalSum));
	sum.AddFunction(GetSumAggregate(PhysicalType::BOOL));
	sum.AddFunction(GetSumAggregate(PhysicalType::INT16));
	sum.AddFunction(GetSumAggregate(PhysicalType::INT32));
	sum.AddFunction(GetSumAggregate(PhysicalType::INT64));
	sum.AddFunction(GetSumAggregate(PhysicalType::INT128));
	sum.AddFunction(AggregateFunction::UnaryAggregate<SumState<double>, double, double, NumericSumOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE));
	return sum;
}